

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

void share_receive(Plug *plug,int urgent,char *data,size_t len)

{
  char cVar1;
  undefined1 uVar2;
  PlugVtable *pPVar3;
  uint uVar4;
  uint32_t uVar5;
  int iVar6;
  ssh_sharing_connstate *cs_00;
  Plug *pPVar7;
  char *pcVar8;
  ptrlen pVar9;
  char *buf_2;
  ptrlen verstring;
  char *buf_1;
  char *buf;
  int *crLine;
  uchar c;
  ssh_sharing_connstate *cs;
  size_t len_local;
  char *data_local;
  int urgent_local;
  Plug *plug_local;
  
  cs_00 = (ssh_sharing_connstate *)(plug + -0x810);
  pPVar7 = plug + -0x80d;
  iVar6 = *(int *)&plug[-0x80d].vt;
  cs = (ssh_sharing_connstate *)len;
  len_local = (size_t)data;
  if (iVar6 == 0) {
    plug[-9].vt = (PlugVtable *)0x0;
  }
  else if (iVar6 != 0x6e9) {
    if (iVar6 == 0x70e) goto LAB_00154df9;
    if (iVar6 == 0x71b) goto LAB_00154ee3;
    goto LAB_00154f76;
  }
  while( true ) {
    if (cs == (ssh_sharing_connstate *)0x0) {
      *(undefined4 *)&pPVar7->vt = 0x6e9;
      return;
    }
    cs = (ssh_sharing_connstate *)((long)&cs[-1].plug.vt + 7);
    cVar1 = *(char *)len_local;
    if (cVar1 == '\n') break;
    if ((PlugVtable *)0x400f < plug[-9].vt) {
      pcVar8 = dupprintf("Version string far too long\n");
      share_disconnect(cs_00,pcVar8);
      safefree(pcVar8);
      goto LAB_00154f76;
    }
    pPVar3 = plug[-9].vt;
    plug[-9].vt = (PlugVtable *)((long)&pPVar3->log + 1);
    ((undefined1 *)((long)&plug[-0x80c].vt + 4))[(long)pPVar3] = cVar1;
    len_local = len_local + 1;
  }
  if ((plug[-9].vt < (PlugVtable *)0x2e) ||
     (iVar6 = memcmp((void *)((long)&plug[-0x80c].vt + 4),
                     "SSHCONNECTION@putty.projects.tartarus.org-2.0-",0x2e), iVar6 != 0)) {
    pcVar8 = dupprintf("Version string did not have expected prefix\n");
    share_disconnect(cs_00,pcVar8);
    safefree(pcVar8);
  }
  else {
    if ((plug[-9].vt != (PlugVtable *)0x0) &&
       (((undefined1 *)((long)&(plug[-9].vt)->accepting + 3))[(long)(cs_00->recvbuf + -0x24)] ==
        '\r')) {
      plug[-9].vt = (PlugVtable *)((long)&plug[-9].vt[-1].accepting + 7);
    }
    pVar9 = make_ptrlen((void *)((long)&plug[-0x80c].vt + 4),(size_t)plug[-9].vt);
    verstring.ptr = (void *)pVar9.len;
    uVar4 = string_length_for_printf((size_t)verstring.ptr);
    buf_2 = (char *)pVar9.ptr;
    log_downstream(cs_00,"Downstream version string: %.*s",(ulong)uVar4,buf_2);
    *(undefined1 *)((long)&plug[-0x80d].vt + 5) = 1;
    len_local = len_local + 1;
    while( true ) {
      plug[-9].vt = (PlugVtable *)0x0;
      while (plug[-9].vt < (PlugVtable *)0x4) {
LAB_00154df9:
        if (cs == (ssh_sharing_connstate *)0x0) {
          *(undefined4 *)&pPVar7->vt = 0x70e;
          return;
        }
        cs = (ssh_sharing_connstate *)((long)&cs[-1].plug.vt + 7);
        uVar2 = *(undefined1 *)len_local;
        pPVar3 = plug[-9].vt;
        plug[-9].vt = (PlugVtable *)((long)&pPVar3->log + 1);
        ((undefined1 *)((long)&plug[-0x80c].vt + 4))[(long)pPVar3] = uVar2;
        len_local = len_local + 1;
      }
      uVar5 = GET_32BIT_MSB_FIRST((void *)((long)&plug[-0x80c].vt + 4));
      iVar6 = toint(uVar5 + 4);
      *(int *)&plug[-0x80c].vt = iVar6;
      if ((*(int *)&plug[-0x80c].vt < 5) || (0x4010 < *(uint *)&plug[-0x80c].vt)) break;
      while (plug[-9].vt < (PlugVtable *)(long)*(int *)&plug[-0x80c].vt) {
LAB_00154ee3:
        if (cs == (ssh_sharing_connstate *)0x0) {
          *(undefined4 *)&pPVar7->vt = 0x71b;
          return;
        }
        cs = (ssh_sharing_connstate *)((long)&cs[-1].plug.vt + 7);
        uVar2 = *(undefined1 *)len_local;
        pPVar3 = plug[-9].vt;
        plug[-9].vt = (PlugVtable *)((long)&pPVar3->log + 1);
        ((undefined1 *)((long)&plug[-0x80c].vt + 4))[(long)pPVar3] = uVar2;
        len_local = len_local + 1;
      }
      share_got_pkt_from_downstream
                (cs_00,(uint)*(byte *)&plug[-0x80b].vt,(uchar *)((long)&plug[-0x80b].vt + 1),
                 (int)plug[-9].vt + -5);
    }
    pcVar8 = dupprintf("Bad packet length %u\n",(ulong)*(uint *)&plug[-0x80c].vt);
    share_disconnect(cs_00,pcVar8);
    safefree(pcVar8);
  }
LAB_00154f76:
  *(undefined4 *)&pPVar7->vt = 0;
  return;
}

Assistant:

static void share_receive(Plug *plug, int urgent, const char *data, size_t len)
{
    ssh_sharing_connstate *cs = container_of(
        plug, ssh_sharing_connstate, plug);
    static const char expected_verstring_prefix[] =
        "SSHCONNECTION@putty.projects.tartarus.org-2.0-";
    unsigned char c;

    crBegin(cs->crLine);

    /*
     * First read the version string from downstream.
     */
    cs->recvlen = 0;
    while (1) {
        crGetChar(c);
        if (c == '\012')
            break;
        if (cs->recvlen >= sizeof(cs->recvbuf)) {
            char *buf = dupprintf("Version string far too long\n");
            share_disconnect(cs, buf);
            sfree(buf);
            goto dead;
        }
        cs->recvbuf[cs->recvlen++] = c;
    }

    /*
     * Now parse the version string to make sure it's at least vaguely
     * sensible, and log it.
     */
    if (cs->recvlen < sizeof(expected_verstring_prefix)-1 ||
        memcmp(cs->recvbuf, expected_verstring_prefix,
               sizeof(expected_verstring_prefix) - 1)) {
        char *buf = dupprintf("Version string did not have expected prefix\n");
        share_disconnect(cs, buf);
        sfree(buf);
        goto dead;
    }
    if (cs->recvlen > 0 && cs->recvbuf[cs->recvlen-1] == '\015')
        cs->recvlen--;                 /* trim off \r before \n */
    ptrlen verstring = make_ptrlen(cs->recvbuf, cs->recvlen);
    log_downstream(cs, "Downstream version string: %.*s",
                   PTRLEN_PRINTF(verstring));
    cs->got_verstring = true;

    /*
     * Loop round reading packets.
     */
    while (1) {
        cs->recvlen = 0;
        while (cs->recvlen < 4) {
            crGetChar(c);
            cs->recvbuf[cs->recvlen++] = c;
        }
        cs->curr_packetlen = toint(GET_32BIT_MSB_FIRST(cs->recvbuf) + 4);
        if (cs->curr_packetlen < 5 ||
            cs->curr_packetlen > sizeof(cs->recvbuf)) {
            char *buf = dupprintf("Bad packet length %u\n",
                                  (unsigned)cs->curr_packetlen);
            share_disconnect(cs, buf);
            sfree(buf);
            goto dead;
        }
        while (cs->recvlen < cs->curr_packetlen) {
            crGetChar(c);
            cs->recvbuf[cs->recvlen++] = c;
        }

        share_got_pkt_from_downstream(cs, cs->recvbuf[4],
                                      cs->recvbuf + 5, cs->recvlen - 5);
    }

  dead:;
    crFinishV;
}